

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Texture1D * __thiscall tcu::Texture1D::operator=(Texture1D *this,Texture1D *other)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  Texture1DView local_30;
  Texture1D *local_20;
  Texture1D *other_local;
  Texture1D *this_local;
  
  if (this != other) {
    local_20 = other;
    other_local = this;
    TextureLevelPyramid::operator=
              (&this->super_TextureLevelPyramid,&other->super_TextureLevelPyramid);
    this->m_width = local_20->m_width;
    numLevels = TextureLevelPyramid::getNumLevels(&this->super_TextureLevelPyramid);
    levels = &TextureLevelPyramid::getLevels(&this->super_TextureLevelPyramid)->
              super_ConstPixelBufferAccess;
    Texture1DView::Texture1DView(&local_30,numLevels,levels);
    (this->m_view).m_numLevels = local_30.m_numLevels;
    *(undefined4 *)&(this->m_view).field_0x4 = local_30._4_4_;
    (this->m_view).m_levels = local_30.m_levels;
  }
  return this;
}

Assistant:

Texture1D& Texture1D::operator= (const Texture1D& other)
{
	if (this == &other)
		return *this;

	TextureLevelPyramid::operator=(other);

	m_width		= other.m_width;
	m_view		= Texture1DView(getNumLevels(), getLevels());

	return *this;
}